

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_window.c
# Opt level: O3

void fitToMonitor(_GLFWwindow *window)

{
  GLFWvidmode mode;
  GLFWvidmode local_28;
  
  _glfwGetVideoModeNull(window->monitor,&local_28);
  _glfwGetMonitorPosNull(window->monitor,&(window->null).xpos,&(window->null).ypos);
  (window->null).width = local_28.width;
  (window->null).height = local_28.height;
  return;
}

Assistant:

static void fitToMonitor(_GLFWwindow* window)
{
    GLFWvidmode mode;
    _glfwGetVideoModeNull(window->monitor, &mode);
    _glfwGetMonitorPosNull(window->monitor,
                           &window->null.xpos,
                           &window->null.ypos);
    window->null.width = mode.width;
    window->null.height = mode.height;
}